

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  byte bVar1;
  short sVar2;
  pointer ppNVar3;
  NPC *this_00;
  Character *this_01;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ENF_Data *pEVar8;
  int i;
  uint uVar9;
  pointer ppNVar10;
  list<Character_*,_std::allocator<Character_*>_> *plVar11;
  _List_node_base *p_Var12;
  double dVar13;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (this->alive == false) {
    pEVar8 = ENF(this);
    if ((parent == (NPC *)0x0) && (pEVar8->boss != 0)) {
      ppNVar3 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar10 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppNVar10 != ppNVar3; ppNVar10 = ppNVar10 + 1
          ) {
        this_00 = *ppNVar10;
        pEVar8 = ENF(this_00);
        if (pEVar8->child != 0) {
          Spawn(this_00,this);
        }
      }
    }
    if (parent != (NPC *)0x0) {
      this->parent = parent;
    }
    if (this->spawn_type < 7) {
      uVar9 = 0;
      do {
        if ((uVar9 == 0) && (this->temporary != false)) {
          this->x = this->spawn_x;
          this->y = this->spawn_y;
        }
        else {
          iVar7 = util::rand();
          this->x = (uchar)iVar7;
          iVar7 = util::rand();
          this->y = (uchar)iVar7;
        }
        bVar4 = Map::Walkable(this->map,this->x,this->y,true);
        if ((bVar4) &&
           ((100 < uVar9 || (bVar4 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false), !bVar4)
            ))) {
          iVar7 = util::rand();
          this->direction = (Direction)iVar7;
          bVar4 = true;
          goto LAB_00164bf5;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 200);
      bVar4 = false;
LAB_00164bf5:
      if (!bVar4) {
        sVar2 = this->map->id;
        bVar6 = this->spawn_x;
        bVar1 = this->spawn_y;
        pEVar8 = ::ENF::Get(this->map->world->enf,this->id);
        Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                     (ulong)(uint)(int)sVar2,(ulong)bVar6,(ulong)bVar1,
                     (pEVar8->name)._M_dataplus._M_p);
        bVar6 = this->spawn_x - 2;
        this->x = bVar6;
        if ((uint)bVar6 <= this->spawn_x + 2) {
          do {
            bVar6 = this->spawn_y - 2;
            this->y = bVar6;
            if ((uint)bVar6 <= this->spawn_y + 2) {
              do {
                bVar5 = Map::Walkable(this->map,this->x,bVar6,true);
                if (bVar5) {
                  Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
                  bVar4 = true;
                  goto LAB_00164cc4;
                }
                bVar6 = this->y + 1;
                this->y = bVar6;
              } while ((uint)bVar6 <= this->spawn_y + 2);
            }
            bVar6 = this->x + 1;
            this->x = bVar6;
          } while ((uint)bVar6 <= this->spawn_x + 2);
        }
      }
LAB_00164cc4:
      if (!bVar4) {
        Console::Err("NPC couldn\'t spawn anywhere valid!");
      }
    }
    this->alive = true;
    pEVar8 = ENF(this);
    this->hp = pEVar8->hp;
    dVar13 = Timer::GetTime();
    this->last_act = dVar13;
    this->act_speed = speed_table[this->spawn_type];
    PacketBuilder::PacketBuilder(&local_60,PACKET_APPEAR,PACKET_REPLY,8);
    PacketBuilder::AddChar(&local_60,'\0');
    PacketBuilder::AddByte(&local_60,0xff);
    PacketBuilder::AddChar(&local_60,this->index);
    PacketBuilder::AddShort(&local_60,(unsigned_short)this->id);
    PacketBuilder::AddChar(&local_60,this->x);
    PacketBuilder::AddChar(&local_60,this->y);
    PacketBuilder::AddChar(&local_60,this->direction);
    p_Var12 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar11 = &this->map->characters;
    if (p_Var12 != (_List_node_base *)plVar11) {
      do {
        this_01 = (Character *)p_Var12[1]._M_next;
        if ((this_01->nowhere == false) &&
           (bVar4 = Character::InRange(this_01,this->x,this->y), bVar4)) {
          EOClient::Send(this_01->player->client,&local_60);
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)plVar11);
    }
    PacketBuilder::~PacketBuilder(&local_60);
  }
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_APPEAR, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}